

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * __thiscall
anon_unknown.dwarf_1a3010::CreateConstruct
          (anon_unknown_dwarf_1a3010 *this,VmModule *module,SynBase *source,VmType type,VmValue *el0
          ,VmValue *el1,VmValue *el2,VmValue *el3)

{
  VmInstruction *pVVar1;
  VmType type_00;
  int local_3c;
  uint size;
  VmValue *el1_local;
  VmValue *el0_local;
  SynBase *source_local;
  VmModule *module_local;
  VmType type_local;
  
  type_00._0_8_ = type._0_8_;
  local_3c = *(int *)((long)&((type.structType)->name).begin + 4);
  if (el0 != (VmValue *)0x0) {
    local_3c = (el0->type).size + local_3c;
  }
  if (el1 != (VmValue *)0x0) {
    local_3c = (el1->type).size + local_3c;
  }
  if (el2 != (VmValue *)0x0) {
    local_3c = (el2->type).size + local_3c;
  }
  module_local._4_4_ = (int)((ulong)source >> 0x20);
  if (module_local._4_4_ == local_3c) {
    type_00.structType = (TypeBase *)0x49;
    pVVar1 = CreateInstruction(this,module,source,type_00,(VmInstructionType)type.structType,el0,el1
                               ,el2,(VmValue *)source);
    return &pVVar1->super_VmValue;
  }
  __assert_fail("type.size == size",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x32c,
                "VmValue *(anonymous namespace)::CreateConstruct(VmModule *, SynBase *, VmType, VmValue *, VmValue *, VmValue *, VmValue *)"
               );
}

Assistant:

VmValue* CreateConstruct(VmModule *module, SynBase *source, VmType type, VmValue *el0, VmValue *el1, VmValue *el2, VmValue *el3)
	{
		unsigned size = el0->type.size;

		if(el1)
			size += el1->type.size;

		if(el2)
			size += el2->type.size;

		if(el3)
			size += el3->type.size;

		assert(type.size == size);

		return CreateInstruction(module, source, type, VM_INST_CONSTRUCT, el0, el1, el2, el3);
	}